

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tunnel_connector.cpp
# Opt level: O2

shared_ptr<bidfx_public_api::tools::Client> __thiscall
bidfx_public_api::tools::TunnelConnector::Connect(TunnelConnector *this,milliseconds read_timeout)

{
  logger *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  char cVar2;
  pointer in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<bidfx_public_api::tools::Client> sVar3;
  undefined1 local_6c [36];
  undefined1 local_48 [16];
  shared_ptr<bidfx_public_api::tools::Client> client;
  milliseconds read_timeout_local;
  
  client.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  client.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar2 = (**(code **)(**(long **)read_timeout.__r + 0x40))();
  this_00 = Log;
  if (cVar2 == '\0') {
    (**(code **)**(undefined8 **)read_timeout.__r)(local_6c + 4);
    local_48._0_4_ = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    spdlog::logger::info<std::__cxx11::string,int>
              (this_00,"Connecting to {}:{}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_6c + 4),
               (int *)local_48);
    std::__cxx11::string::~string((string *)(local_6c + 4));
    (**(code **)**(undefined8 **)read_timeout.__r)(local_6c + 4);
    local_6c._0_4_ = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    std::make_shared<bidfx_public_api::tools::DirectClient,std::__cxx11::string,int>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (int *)(local_6c + 4));
    std::__shared_ptr<bidfx_public_api::tools::Client,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<bidfx_public_api::tools::Client,(__gnu_cxx::_Lock_policy)2> *)&client,
               (__shared_ptr<bidfx_public_api::tools::DirectClient,_(__gnu_cxx::_Lock_policy)2> *)
               local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    std::__cxx11::string::~string((string *)(local_6c + 4));
    (*(client.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      )->_vptr_Client[2])();
  }
  else {
    (**(code **)**(undefined8 **)read_timeout.__r)(local_6c + 4);
    local_6c._0_4_ = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    local_48._0_8_ = in_RDX;
    spdlog::logger::info<std::__cxx11::string,int,long>
              (this_00,"Connecting using SSL to {}:{} with read timeout {}ms",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_6c + 4),
               (int *)local_6c,(long *)local_48);
    std::__cxx11::string::~string((string *)(local_6c + 4));
    (**(code **)**(undefined8 **)read_timeout.__r)(local_6c + 4);
    local_6c._0_4_ = (**(code **)(**(long **)read_timeout.__r + 0x38))();
    std::
    make_shared<bidfx_public_api::tools::OpenSSLClient,std::__cxx11::string,int,std::chrono::duration<long,std::ratio<1l,1000l>>&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (int *)(local_6c + 4),(duration<long,_std::ratio<1L,_1000L>_> *)local_6c);
    std::__shared_ptr<bidfx_public_api::tools::Client,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<bidfx_public_api::tools::Client,(__gnu_cxx::_Lock_policy)2> *)&client,
               (__shared_ptr<bidfx_public_api::tools::OpenSSLClient,_(__gnu_cxx::_Lock_policy)2> *)
               local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    std::__cxx11::string::~string((string *)(local_6c + 4));
    (*(client.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      )->_vptr_Client[2])();
    TunnelThroughToServer
              ((TunnelConnector *)read_timeout.__r,
               client.
               super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  _Var1._M_pi = client.
                super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  client.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->user_info_ =
       (UserInfo *)
       client.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  (this->service_)._M_dataplus._M_p = (pointer)_Var1._M_pi;
  client.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&client.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar3.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<bidfx_public_api::tools::Client>)
         sVar3.super___shared_ptr<bidfx_public_api::tools::Client,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Client> TunnelConnector::Connect(std::chrono::milliseconds read_timeout)
{
    try
    {
        std::shared_ptr<Client> client = nullptr;

        if (user_info_.IsTunnelRequired())
        {
            Log->info("Connecting using SSL to {}:{} with read timeout {}ms", user_info_.GetHost(), user_info_.GetPort(), read_timeout.count());
            client = std::make_shared<OpenSSLClient>(user_info_.GetHost(), user_info_.GetPort(), read_timeout);
            client->Start();
            TunnelThroughToServer(*client);
        }
        else
        {
            Log->info("Connecting to {}:{}", user_info_.GetHost(), user_info_.GetPort());
            client = std::make_shared<DirectClient>(user_info_.GetHost(), user_info_.GetPort());
            client->Start();
        }

        return std::move(client);
    }
    catch (std::ios_base::failure &e)
    {
        Log->warn("exception during handshake: {}", e.what());
        throw std::ios_base::failure(e);
    }
}